

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtrclient.c
# Opt level: O0

void init_sockets(void)

{
  long lVar1;
  socket_config *psVar2;
  long in_FS_OFFSET;
  socket_config *config;
  size_t i;
  tr_tcp_config tcp_config;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  for (config = (socket_config *)0x0; config < socket_count;
      config = (socket_config *)((long)&(config->socket).tr_socket + 1)) {
    psVar2 = socket_config[(long)config];
    tcp_config.data = (void *)0x0;
    tcp_config.new_socket = (_func_int_void_ptr *)0x0;
    tcp_config.port = (char *)0x0;
    tcp_config.bindaddr = (char *)0x0;
    i = 0;
    tcp_config.host = (char *)0x0;
    if (psVar2->type == SOCKET_TYPE_TCP) {
      i = (size_t)psVar2->host;
      tcp_config.host = psVar2->port;
      tcp_config.port = psVar2->bindaddr;
      tr_tcp_init(&i,&psVar2->tr_socket);
      (psVar2->socket).tr_socket = &psVar2->tr_socket;
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

static void init_sockets(void)
{
	for (size_t i = 0; i < socket_count; ++i) {
		struct socket_config *config = socket_config[i];
		struct tr_tcp_config tcp_config = {};
#ifdef RTRLIB_HAVE_LIBSSH
		struct tr_ssh_config ssh_config = {};
#endif

		switch (config->type) {
		case SOCKET_TYPE_TCP:
			tcp_config.host = config->host;
			tcp_config.port = config->port;
			tcp_config.bindaddr = config->bindaddr;

			tr_tcp_init(&tcp_config, &config->tr_socket);
			config->socket.tr_socket = &config->tr_socket;
			break;

#ifdef RTRLIB_HAVE_LIBSSH
		case SOCKET_TYPE_SSH:
			ssh_config.host = config->host;
			ssh_config.port = atoi(config->port);
			ssh_config.bindaddr = config->bindaddr;
			ssh_config.username = config->ssh_username;
			ssh_config.client_privkey_path = config->ssh_private_key;
			ssh_config.server_hostkey_path = config->ssh_host_key;
			ssh_config.password = config->ssh_password;

			tr_ssh_init(&ssh_config, &config->tr_socket);
			config->socket.tr_socket = &config->tr_socket;
			break;
#endif
		}
	}
}